

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsGetEmbedderData(JsValueRef instance,JsValueRef *embedderData)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  BOOL BVar5;
  uint uVar6;
  int iVar7;
  JsrtContext *currentContext;
  RecyclableObject *pRVar8;
  undefined4 *puVar9;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (instance == (JsValueRef)0x0) {
    JVar4 = JsErrorInvalidArgument;
  }
  else if (embedderData == (JsValueRef *)0x0) {
    JVar4 = JsErrorNullArgument;
  }
  else {
    currentContext = JsrtContext::GetCurrent();
    JVar4 = CheckContext(currentContext,false,false);
    if (JVar4 == JsNoError) {
      pSVar1 = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      bVar3 = Js::VarIs<Js::RecyclableObject>(instance);
      JVar4 = JsErrorInvalidArgument;
      if (bVar3) {
        pRVar8 = Js::UnsafeVarTo<Js::RecyclableObject>(instance);
        if (pRVar8 != (RecyclableObject *)0x0) {
          BVar5 = Js::TypedArrayBase::Is(((pRVar8->type).ptr)->typeId);
          if ((BVar5 == 0) &&
             ((uVar6 = ((pRVar8->type).ptr)->typeId - TypeIds_ArrayBuffer, 0x20 < uVar6 ||
              ((0x100008001U >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar9 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                               ,0x212,
                               "(Js::TypedArrayBase::Is(object->GetTypeId()) || object->GetTypeId() == Js::TypeIds_ArrayBuffer || object->GetTypeId() == Js::TypeIds_DataView || object->GetTypeId() == Js::TypeIds_SharedArrayBuffer)"
                               ,
                               "Js::TypedArrayBase::Is(object->GetTypeId()) || object->GetTypeId() == Js::TypeIds_ArrayBuffer || object->GetTypeId() == Js::TypeIds_DataView || object->GetTypeId() == Js::TypeIds_SharedArrayBuffer"
                              );
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar9 = 0;
          }
          JVar4 = JsNoError;
          iVar7 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x14])(pRVar8,pRVar8,0xf,embedderData,0,pSVar1);
          if (iVar7 == 0) {
            *embedderData = (JsValueRef)0x0;
          }
        }
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
    }
  }
  return JVar4;
}

Assistant:

END_JSRT_NO_EXCEPTION
}


CHAKRA_API
JsGetEmbedderData(
    _In_ JsValueRef instance,
    _Out_ JsValueRef* embedderData)
{
   VALIDATE_JSREF(instance);
   PARAM_NOT_NULL(embedderData);
   return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        Js::RecyclableObject* object = Js::JavascriptOperators::TryFromVar<Js::RecyclableObject>(instance);
        if (!object)
        {
            return JsErrorInvalidArgument;
        }

        // Right now we know that we support these many. Lets find out if
        // there are more.
        Assert(Js::TypedArrayBase::Is(object->GetTypeId()) ||
               object->GetTypeId() == Js::TypeIds_ArrayBuffer ||
               object->GetTypeId() == Js::TypeIds_DataView ||
               object->GetTypeId() == Js::TypeIds_SharedArrayBuffer);

        if (!object->GetInternalProperty(object, Js::InternalPropertyIds::EmbedderData, embedderData, nullptr, scriptContext))
        {
            *embedderData = nullptr;
        }
        return JsNoError;
    });
}